

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_service_client(t_javame_generator *this,t_service *tservice)

{
  int *piVar1;
  undefined **ppuVar2;
  size_type *psVar3;
  pointer pcVar4;
  t_function *tfunction;
  t_type *ptVar5;
  t_struct *ptVar6;
  int iVar7;
  long *plVar8;
  ostream *poVar9;
  undefined **ppuVar10;
  size_type *psVar11;
  pointer pptVar12;
  char *pcVar13;
  t_javame_generator *this_00;
  pointer pptVar14;
  bool bVar15;
  char *__end;
  ofstream_with_content_based_conditional_update *os;
  string resultname;
  t_struct noargs;
  string argsname;
  string funname;
  string extends;
  string extends_client;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_function recv_function;
  t_function send_function;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  t_struct *local_4e0;
  undefined1 local_4d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4c0;
  bool local_4b0;
  _Rb_tree_node_base local_4a0;
  size_t local_480;
  t_program *local_478;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  pointer local_450;
  pointer pptStack_448;
  pointer local_440;
  pointer pptStack_438;
  pointer local_430;
  undefined7 uStack_428;
  undefined4 uStack_421;
  int local_41c;
  bool local_418;
  string local_410;
  size_type *local_3f0;
  pointer local_3e8;
  size_type local_3e0;
  undefined8 uStack_3d8;
  char *local_3d0;
  long local_3c8;
  char local_3c0 [16];
  char *local_3b0;
  long local_3a8;
  char local_3a0 [16];
  string local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  char *local_330;
  long local_328;
  char local_320 [16];
  ofstream_with_content_based_conditional_update *local_310;
  vector<t_function_*,_std::allocator<t_function_*>_> local_308;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  t_function local_170;
  t_function local_d0;
  
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"","");
  local_330 = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"","");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_
              ((string *)local_4d8,this,&tservice->extends_->super_t_type,false,false,false);
    std::__cxx11::string::operator=((string *)&local_350,(string *)local_4d8);
    ppuVar2 = (undefined **)(local_4d8 + 0x10);
    if ((undefined **)local_4d8._0_8_ != ppuVar2) {
      operator_delete((void *)local_4d8._0_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                   " extends ",&local_350);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    ppuVar10 = (undefined **)(plVar8 + 2);
    if ((undefined **)*plVar8 == ppuVar10) {
      local_4d8._16_8_ = *ppuVar10;
      aStack_4c0._M_allocated_capacity = plVar8[3];
      local_4d8._0_8_ = ppuVar2;
    }
    else {
      local_4d8._16_8_ = *ppuVar10;
      local_4d8._0_8_ = (undefined **)*plVar8;
    }
    local_4d8._8_8_ = plVar8[1];
    *plVar8 = (long)ppuVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_330,(string *)local_4d8);
    if ((undefined **)local_4d8._0_8_ != ppuVar2) {
      operator_delete((void *)local_4d8._0_8_);
    }
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
  }
  os = &this->f_service_;
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"public static class Client",0x1a);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_330,local_328);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9," implements TServiceClient, Iface {",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"public Client(TProtocol prot)",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"this(prot, prot);",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"public Client(TProtocol iprot, TProtocol oprot)",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
  if (local_350._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"iprot_ = iprot;",0xf);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_d0.super_t_doc._vptr_t_doc,
                        (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"oprot_ = oprot;",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
  }
  else {
    t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"super(iprot, oprot);",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_350._M_string_length == 0) {
    t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"protected TProtocol iprot_;",0x1b);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_d0,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_d0.super_t_doc._vptr_t_doc,
                        (long)local_d0.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"protected TProtocol oprot_;",0x1b);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)local_170.super_t_doc._vptr_t_doc,
                        (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"protected int seqid_;",0x15);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_170.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_170.super_t_doc.doc_._M_string_length) {
      operator_delete(local_170.super_t_doc._vptr_t_doc);
    }
    if (local_d0.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_d0.super_t_doc.doc_._M_string_length) {
      operator_delete(local_d0.super_t_doc._vptr_t_doc);
    }
    if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_);
    }
    poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"public TProtocol getInputProtocol()",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return this.iprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"public TProtocol getOutputProtocol()",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
    poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return this.oprot_;",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_308,&tservice->functions_)
  ;
  if (local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar3 = &local_170.super_t_doc.doc_._M_string_length;
    pptVar12 = local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_310 = os;
    do {
      local_3b0 = local_3a0;
      pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"public ",7);
      tfunction = *pptVar12;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
      function_signature((string *)local_4d8,this,tfunction,&local_190);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_4d8._0_8_,local_4d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"send_",5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_3b0,local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
      local_4e0 = (*pptVar12)->arglist_;
      pptVar14 = (local_4e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar14 !=
          (local_4e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar15 = true;
        do {
          if (bVar15) {
            bVar15 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)os,((*pptVar14)->name_)._M_dataplus._M_p,
                     ((*pptVar14)->name_)._M_string_length);
          pptVar14 = pptVar14 + 1;
        } while (pptVar14 !=
                 (local_4e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      if ((*pptVar12)->oneway_ == false) {
        t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_);
        }
        iVar7 = (*((*pptVar12)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar7 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"return ",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"recv_",5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_3b0,local_3a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      ptVar5 = g_type_void;
      local_4d8._0_8_ = local_4d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"send_","");
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_4d8,(ulong)((*pptVar12)->name_)._M_dataplus._M_p);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_370.field_2._M_allocated_capacity = *psVar11;
        local_370.field_2._8_8_ = plVar8[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar11;
        local_370._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_370._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      t_function::t_function(&local_d0,ptVar5,&local_370,(*pptVar12)->arglist_,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      local_3d0 = local_3c0;
      pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_3d0);
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"public ",7);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
      function_signature((string *)local_4d8,this,&local_d0,&local_1b0);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_4d8._0_8_,local_4d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
      t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"oprot_.writeMessageBegin(new TMessage(\"",0x27);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_3b0,local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\", ",3);
      pcVar13 = "TMessageType.CALL";
      if ((*pptVar12)->oneway_ != false) {
        pcVar13 = "TMessageType.ONEWAY";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,pcVar13,(ulong)(*pptVar12)->oneway_ * 2 + 0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ++seqid_));",0xd);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_170.super_t_doc._vptr_t_doc,
                          (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_3d0,local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," args = new ",0xc);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_3d0,local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"();",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_170.super_t_doc._vptr_t_doc != (_func_int **)psVar3) {
        operator_delete(local_170.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      for (pptVar14 = (local_4e0->members_).
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar14 !=
          (local_4e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
        t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"args.set",8);
        pcVar4 = ((*pptVar14)->name_)._M_dataplus._M_p;
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f0,pcVar4,pcVar4 + ((*pptVar14)->name_)._M_string_length);
        psVar11 = local_3f0;
        iVar7 = toupper((int)(char)*local_3f0);
        *(char *)psVar11 = (char)iVar7;
        pcVar4 = local_3e8;
        if (local_3f0 == &local_3e0) {
          local_170.super_t_doc.doc_.field_2._0_8_ = uStack_3d8;
          local_170.super_t_doc._vptr_t_doc = (_func_int **)psVar3;
        }
        else {
          local_170.super_t_doc._vptr_t_doc = (_func_int **)local_3f0;
        }
        local_170.super_t_doc.doc_._M_string_length =
             CONCAT71(local_3e0._1_7_,(undefined1)local_3e0);
        local_170.super_t_doc.doc_._M_dataplus._M_p = local_3e8;
        local_3e8 = (pointer)0x0;
        local_3e0._0_1_ = 0;
        local_3f0 = &local_3e0;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(char *)local_170.super_t_doc._vptr_t_doc,(long)pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,((*pptVar14)->name_)._M_dataplus._M_p,
                            ((*pptVar14)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_170.super_t_doc._vptr_t_doc != (_func_int **)psVar3) {
          operator_delete(local_170.super_t_doc._vptr_t_doc);
        }
        os = local_310;
        if (local_3f0 != &local_3e0) {
          operator_delete(local_3f0);
        }
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_);
        }
      }
      t_generator::indent_abi_cxx11_((string *)local_4d8,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(char *)local_4d8._0_8_,local_4d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"args.write(oprot_);",0x13);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&local_170,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_170.super_t_doc._vptr_t_doc,
                          (long)local_170.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"oprot_.writeMessageEnd();",0x19);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_500,(t_generator *)this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_500._M_dataplus._M_p,local_500._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"oprot_.getTransport().flush();",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._M_dataplus._M_p != &local_500.field_2) {
        operator_delete(local_500._M_dataplus._M_p);
      }
      if (local_170.super_t_doc._vptr_t_doc != (_func_int **)psVar3) {
        operator_delete(local_170.super_t_doc._vptr_t_doc);
      }
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      if ((*pptVar12)->oneway_ == false) {
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        pcVar4 = ((*pptVar12)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_500,pcVar4,pcVar4 + ((*pptVar12)->name_)._M_string_length);
        std::__cxx11::string::append((char *)&local_500);
        local_478 = (this->super_t_oop_generator).super_t_generator.program_;
        local_4d8._8_8_ = &aStack_4c0;
        local_4d8._16_8_ = (undefined *)0x0;
        aStack_4c0._0_8_ = aStack_4c0._0_8_ & 0xffffffffffffff00;
        local_4b0 = false;
        local_4a0._M_color = _S_red;
        local_4a0._M_parent = (_Base_ptr)0x0;
        local_4a0._M_left = &local_4a0;
        local_480 = 0;
        local_470._M_p = (pointer)&local_460;
        local_468 = 0;
        local_460._M_local_buf[0] = '\0';
        local_4d8._0_8_ = &PTR__t_struct_0040eef0;
        local_41c = 0;
        local_418 = false;
        local_430 = (pointer)0x0;
        uStack_428 = 0;
        uStack_421 = 0;
        local_440 = (pointer)0x0;
        pptStack_438 = (pointer)0x0;
        local_450 = (pointer)0x0;
        pptStack_448 = (pointer)0x0;
        ptVar5 = (*pptVar12)->returntype_;
        local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
        local_4a0._M_right = local_4a0._M_left;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"recv_","");
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_560,(ulong)((*pptVar12)->name_)._M_dataplus._M_p)
        ;
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390.field_2._8_8_ = plVar8[3];
        }
        else {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_390._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        t_function::t_function
                  (&local_170,ptVar5,&local_390,(t_struct *)local_4d8,(*pptVar12)->xceptions_,false)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p);
        }
        poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"public ",7);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
        function_signature(&local_560,this,&local_170,&local_1d0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_560._M_dataplus._M_p,local_560._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)os);
        t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_560._M_dataplus._M_p,local_560._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"TMessage msg = iprot_.readMessageBegin();",0x29);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_520,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_520._M_dataplus._M_p,local_520._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"if (msg.type == TMessageType.EXCEPTION) {",0x29);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_540._M_dataplus._M_p,local_540._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"  TApplicationException x = TApplicationException.read(iprot_);",0x3f);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_410._M_dataplus._M_p,local_410._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  iprot_.readMessageEnd();",0x1a)
        ;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  throw x;",10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_210._M_dataplus._M_p,local_210._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"if (msg.seqid != seqid_) {",0x1a)
        ;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \"",
                   0x4a);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,((*pptVar12)->name_)._M_dataplus._M_p,
                            ((*pptVar12)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9," failed: out of sequence response\");",0x24);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_500._M_dataplus._M_p,local_500._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," result = new ",0xe);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_500._M_dataplus._M_p,local_500._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"();",3);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"result.read(iprot_);",0x14);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"iprot_.readMessageEnd();",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_dataplus._M_p != &local_540.field_2) {
          operator_delete(local_540._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p);
        }
        iVar7 = (*((*pptVar12)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar7 == '\0') {
          t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_560._M_dataplus._M_p,local_560._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"if (result.",0xb);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          this_00 = (t_javame_generator *)0x3a4e44;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"success","");
          generate_isset_check(&local_520,this_00,&local_2f0);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_520._M_dataplus._M_p,local_520._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") {",3);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  return result.success;",0x18)
          ;
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_410._M_dataplus._M_p,local_410._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560._M_dataplus._M_p != &local_560.field_2) {
            operator_delete(local_560._M_dataplus._M_p);
          }
        }
        ptVar6 = (*pptVar12)->xceptions_;
        for (pptVar14 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pptVar14 !=
            (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
          t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_560._M_dataplus._M_p,local_560._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"if (result.",0xb);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,((*pptVar14)->name_)._M_dataplus._M_p,
                              ((*pptVar14)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," != null) {",0xb);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_520,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_520._M_dataplus._M_p,local_520._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  throw result.",0xf);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,((*pptVar14)->name_)._M_dataplus._M_p,
                              ((*pptVar14)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_540,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560._M_dataplus._M_p != &local_560.field_2) {
            operator_delete(local_560._M_dataplus._M_p);
          }
        }
        iVar7 = (*((*pptVar12)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar7 == '\0') {
          t_generator::indent_abi_cxx11_(&local_560,(t_generator *)this);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_560._M_dataplus._M_p,local_560._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "throw new TApplicationException(TApplicationException.MISSING_RESULT, \"",0x47
                    );
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,((*pptVar12)->name_)._M_dataplus._M_p,
                              ((*pptVar12)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: unknown result\");",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560._M_dataplus._M_p != &local_560.field_2) {
            operator_delete(local_560._M_dataplus._M_p);
          }
        }
        else {
          poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return;",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        t_function::~t_function(&local_170);
        local_4d8._0_8_ = &PTR__t_struct_0040eef0;
        if (pptStack_438 != (pointer)0x0) {
          operator_delete(pptStack_438);
        }
        if (local_450 != (pointer)0x0) {
          operator_delete(local_450);
        }
        t_type::~t_type((t_type *)local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p);
        }
      }
      if (local_3d0 != local_3c0) {
        operator_delete(local_3d0);
      }
      t_function::~t_function(&local_d0);
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0);
      }
      pptVar12 = pptVar12 + 1;
    } while (pptVar12 !=
             local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar9 = t_generator::indent((t_generator *)this,(ostream *)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_javame_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_client = " extends " + extends + ".Client";
  }

  indent(f_service_) << "public static class Client" << extends_client
                     << " implements TServiceClient, Iface {" << endl;
  indent_up();

  indent(f_service_) << "public Client(TProtocol prot)" << endl;
  scope_up(f_service_);
  indent(f_service_) << "this(prot, prot);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  indent(f_service_) << "public Client(TProtocol iprot, TProtocol oprot)" << endl;
  scope_up(f_service_);
  if (extends.empty()) {
    f_service_ << indent() << "iprot_ = iprot;" << endl << indent() << "oprot_ = oprot;" << endl;
  } else {
    f_service_ << indent() << "super(iprot, oprot);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  if (extends.empty()) {
    f_service_ << indent() << "protected TProtocol iprot_;" << endl << indent()
               << "protected TProtocol oprot_;" << endl << endl << indent()
               << "protected int seqid_;" << endl << endl;

    indent(f_service_) << "public TProtocol getInputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.iprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;

    indent(f_service_) << "public TProtocol getOutputProtocol()" << endl;
    scope_up(f_service_);
    indent(f_service_) << "return this.oprot_;" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();

    // Open function
    indent(f_service_) << "public " << function_signature(*f_iter) << endl;
    scope_up(f_service_);
    indent(f_service_) << "send_" << funname << "(";

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    // Declare the function arguments
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator fld_iter;
    bool first = true;
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << (*fld_iter)->get_name();
    }
    f_service_ << ");" << endl;

    if (!(*f_iter)->is_oneway()) {
      f_service_ << indent();
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << "return ";
      }
      f_service_ << "recv_" << funname << "();" << endl;
    }
    scope_down(f_service_);
    f_service_ << endl;

    t_function send_function(g_type_void,
                             string("send_") + (*f_iter)->get_name(),
                             (*f_iter)->get_arglist());

    string argsname = (*f_iter)->get_name() + "_args";

    // Open function
    indent(f_service_) << "public " << function_signature(&send_function) << endl;
    scope_up(f_service_);

    // Serialize the request
    f_service_ << indent() << "oprot_.writeMessageBegin(new TMessage(\"" << funname << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", ++seqid_));" << endl << indent() << argsname << " args = new " << argsname
               << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(oprot_);" << endl << indent()
               << "oprot_.writeMessageEnd();" << endl << indent()
               << "oprot_.getTransport().flush();" << endl;

    scope_down(f_service_);
    f_service_ << endl;

    if (!(*f_iter)->is_oneway()) {
      string resultname = (*f_iter)->get_name() + "_result";

      t_struct noargs(program_);
      t_function recv_function((*f_iter)->get_returntype(),
                               string("recv_") + (*f_iter)->get_name(),
                               &noargs,
                               (*f_iter)->get_xceptions());
      // Open function
      indent(f_service_) << "public " << function_signature(&recv_function) << endl;
      scope_up(f_service_);

      f_service_ << indent() << "TMessage msg = iprot_.readMessageBegin();" << endl << indent()
                 << "if (msg.type == TMessageType.EXCEPTION) {" << endl << indent()
                 << "  TApplicationException x = TApplicationException.read(iprot_);" << endl
                 << indent() << "  iprot_.readMessageEnd();" << endl << indent() << "  throw x;"
                 << endl << indent() << "}" << endl << indent() << "if (msg.seqid != seqid_) {"
                 << endl << indent()
                 << "  throw new TApplicationException(TApplicationException.BAD_SEQUENCE_ID, \""
                 << (*f_iter)->get_name() << " failed: out of sequence response\");" << endl
                 << indent() << "}" << endl << indent() << resultname << " result = new "
                 << resultname << "();" << endl << indent() << "result.read(iprot_);" << endl
                 << indent() << "iprot_.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        f_service_ << indent() << "if (result." << generate_isset_check("success") << ") {" << endl
                   << indent() << "  return result.success;" << endl << indent() << "}" << endl;
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        f_service_ << indent() << "if (result." << (*x_iter)->get_name() << " != null) {" << endl
                   << indent() << "  throw result." << (*x_iter)->get_name() << ";" << endl
                   << indent() << "}" << endl;
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        f_service_ << indent()
                   << "throw new TApplicationException(TApplicationException.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }

      // Close function
      scope_down(f_service_);
      f_service_ << endl;
    }
  }

  indent_down();
  indent(f_service_) << "}" << endl;
}